

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O1

void cmGeneratorExpression::Split
               (string *input,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *output)

{
  size_type *psVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  undefined8 *puVar6;
  ulong uVar7;
  char *pcVar8;
  string_view arg;
  string_view arg_00;
  string part;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string preGenex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  long *local_b8;
  size_t local_b0;
  long local_a8 [2];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  pcVar8 = (char *)0x0;
  local_98 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)output;
  lVar4 = std::__cxx11::string::find((char *)input,0x732068,0);
  if (lVar4 == -1) {
LAB_00429e60:
    if (pcVar8 < (char *)input->_M_string_length) {
      std::__cxx11::string::substr((ulong)&local_b8,(ulong)input);
      arg_00._M_str = (char *)local_b8;
      arg_00._M_len = local_b0;
      cmExpandList(arg_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_98,false);
      if (local_b8 != local_a8) {
        operator_delete(local_b8,local_a8[0] + 1);
      }
    }
    return;
  }
  pcVar8 = (char *)0x0;
LAB_00429b12:
  std::__cxx11::string::substr((ulong)&local_b8,(ulong)input);
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  if (local_b0 != 0) {
    pcVar5 = (char *)std::__cxx11::string::rfind((char)input,0x3b);
    if (pcVar5 == (char *)0xffffffffffffffff) {
      std::__cxx11::string::_M_assign((string *)&local_70);
      local_b0 = 0;
      *(undefined1 *)local_b8 = 0;
    }
    else if (pcVar8 <= pcVar5 && pcVar5 != (char *)(lVar4 + -1)) {
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)input);
      std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)input);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_b0 != 0) {
      arg._M_str = (char *)local_b8;
      arg._M_len = local_b0;
      cmExpandList(arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_98,false);
    }
  }
  pcVar5 = (input->_M_dataplus)._M_p + lVar4 + 2;
  iVar3 = 1;
  pcVar8 = pcVar5;
  do {
    cVar2 = *pcVar8;
    if (cVar2 == '$') {
      if (pcVar8[1] == '<') {
        iVar3 = iVar3 + 1;
        pcVar8 = pcVar8 + 1;
      }
    }
    else if (cVar2 == '>') {
      iVar3 = iVar3 + -1;
      if (iVar3 == 0) break;
    }
    else if (cVar2 == '\0') break;
    pcVar8 = pcVar8 + 1;
  } while( true );
LAB_00429c81:
  if (*pcVar8 == '\0') goto LAB_00429c92;
  if (*pcVar8 == ';') {
    pcVar8 = pcVar8 + -1;
    goto LAB_00429c92;
  }
  pcVar8 = pcVar8 + 1;
  goto LAB_00429c81;
LAB_00429c92:
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_70,local_70 + local_68);
  std::__cxx11::string::append((char *)&local_90);
  std::__cxx11::string::substr((ulong)&local_50,(ulong)input);
  uVar7 = 0xf;
  if (local_90 != local_80) {
    uVar7 = local_80[0];
  }
  if (uVar7 < (ulong)(local_48 + local_88)) {
    uVar7 = 0xf;
    if (local_50 != local_40) {
      uVar7 = local_40[0];
    }
    if ((ulong)(local_48 + local_88) <= uVar7) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_90);
      goto LAB_00429d52;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_50);
LAB_00429d52:
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  psVar1 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_d8.field_2._M_allocated_capacity = *psVar1;
    local_d8.field_2._8_8_ = puVar6[3];
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar1;
    local_d8._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_d8._M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_98,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  pcVar8 = pcVar8 + lVar4 + 2 + (1 - (long)pcVar5);
  lVar4 = std::__cxx11::string::find((char *)input,0x732068,(ulong)pcVar8);
  if (lVar4 == -1) goto LAB_00429e60;
  goto LAB_00429b12;
}

Assistant:

void cmGeneratorExpression::Split(const std::string& input,
                                  std::vector<std::string>& output)
{
  std::string::size_type pos = 0;
  std::string::size_type lastPos = pos;
  while ((pos = input.find("$<", lastPos)) != std::string::npos) {
    std::string part = input.substr(lastPos, pos - lastPos);
    std::string preGenex;
    if (!part.empty()) {
      std::string::size_type startPos = input.rfind(';', pos);
      if (startPos == std::string::npos) {
        preGenex = part;
        part.clear();
      } else if (startPos != pos - 1 && startPos >= lastPos) {
        part = input.substr(lastPos, startPos - lastPos);
        preGenex = input.substr(startPos + 1, pos - startPos - 1);
      }
      if (!part.empty()) {
        cmExpandList(part, output);
      }
    }
    pos += 2;
    int nestingLevel = 1;
    const char* c = input.c_str() + pos;
    const char* const cStart = c;
    for (; *c; ++c) {
      if (cmGeneratorExpression::StartsWithGeneratorExpression(c)) {
        ++nestingLevel;
        ++c;
        continue;
      }
      if (c[0] == '>') {
        --nestingLevel;
        if (nestingLevel == 0) {
          break;
        }
      }
    }
    for (; *c; ++c) {
      // Capture the part after the genex and before the next ';'
      if (c[0] == ';') {
        --c;
        break;
      }
    }
    const std::string::size_type traversed = (c - cStart) + 1;
    output.push_back(preGenex + "$<" + input.substr(pos, traversed));
    pos += traversed;
    lastPos = pos;
  }
  if (lastPos < input.size()) {
    cmExpandList(input.substr(lastPos), output);
  }
}